

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

int Abc_SopGetIthCareLit(char *pSop,int i)

{
  long lVar1;
  char *pCur;
  char *pcVar2;
  
  lVar1 = 0x100000000;
  pcVar2 = pSop;
  do {
    if (*pcVar2 == '\0') {
      lVar1 = 2;
LAB_00868b51:
      if (*pSop != '\0') {
        do {
          if (pSop[i] != 0x2d) {
            return pSop[i] + -0x30;
          }
          pcVar2 = pSop + lVar1;
          pSop = pSop + lVar1;
        } while (*pcVar2 != '\0');
      }
      return -1;
    }
    if (*pcVar2 == '\n') {
      lVar1 = lVar1 >> 0x20;
      goto LAB_00868b51;
    }
    pcVar2 = pcVar2 + 1;
    lVar1 = lVar1 + 0x100000000;
  } while( true );
}

Assistant:

int Abc_SopGetIthCareLit( char * pSop, int i )
{
    char * pCube;
    int nVars;
    nVars = Abc_SopGetVarNum( pSop );
    Abc_SopForEachCube( pSop, nVars, pCube )
        if ( pCube[i] != '-' )
            return pCube[i] - '0';
    return -1;
}